

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_gzip.c
# Opt level: O1

int drive_compressor(archive_write_filter *f,private_data_conflict6 *data,int finishing)

{
  archive *a;
  size_t sVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  
  do {
    if ((data->stream).avail_out == 0) {
      data->total_out = data->total_out + data->compressed_buffer_size;
      iVar2 = __archive_write_filter(f->next_filter,data->compressed,data->compressed_buffer_size);
      if (iVar2 != 0) {
        return -0x1e;
      }
      sVar1 = data->compressed_buffer_size;
      (data->stream).next_out = data->compressed;
      (data->stream).avail_out = sVar1;
    }
    if ((finishing == 0) && ((data->stream).avail_in == 0)) {
      return 0;
    }
    uVar3 = lzma_code(&data->stream);
    if (uVar3 != 0) {
      if (uVar3 == 1) {
        if (finishing != 0) {
          return 0;
        }
        archive_set_error(f->archive,-1,"lzma compression data error");
      }
      else if (uVar3 == 6) {
        a = f->archive;
        lVar4 = lzma_memusage(&data->stream);
        archive_set_error(a,0xc,"lzma compression error: %ju MiB would have been needed",
                          lVar4 + 0xfffffU >> 0x14);
      }
      else {
        archive_set_error(f->archive,-1,
                          "lzma compression failed: lzma_code() call returned status %d",
                          (ulong)uVar3);
      }
      return -0x1e;
    }
  } while ((finishing != 0) || ((data->stream).avail_in != 0));
  return 0;
}

Assistant:

static int
drive_compressor(struct archive_write_filter *f,
    struct private_data *data, int finishing)
{
	int ret;

	for (;;) {
		if (data->stream.avail_out == 0) {
			ret = __archive_write_filter(f->next_filter,
			    data->compressed,
			    data->compressed_buffer_size);
			if (ret != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			data->stream.next_out = data->compressed;
			data->stream.avail_out =
			    (uInt)data->compressed_buffer_size;
		}

		/* If there's nothing to do, we're done. */
		if (!finishing && data->stream.avail_in == 0)
			return (ARCHIVE_OK);

		ret = deflate(&(data->stream),
		    finishing ? Z_FINISH : Z_NO_FLUSH );

		switch (ret) {
		case Z_OK:
			/* In non-finishing case, check if compressor
			 * consumed everything */
			if (!finishing && data->stream.avail_in == 0)
				return (ARCHIVE_OK);
			/* In finishing case, this return always means
			 * there's more work */
			break;
		case Z_STREAM_END:
			/* This return can only occur in finishing case. */
			return (ARCHIVE_OK);
		default:
			/* Any other return value indicates an error. */
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "GZip compression failed:"
			    " deflate() call returned status %d",
			    ret);
			return (ARCHIVE_FATAL);
		}
	}
}